

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ReporterBase::ReporterBase(ReporterBase *this,ReporterConfig *config)

{
  IConfig *pIVar1;
  int iVar2;
  IStream *pIVar3;
  undefined4 extraout_var;
  
  pIVar1 = config->m_fullConfig;
  (this->super_IEventListener).m_preferences.shouldRedirectStdOut = false;
  (this->super_IEventListener).m_preferences.shouldReportAllAssertions = false;
  (this->super_IEventListener).m_config = pIVar1;
  (this->super_IEventListener)._vptr_IEventListener = (_func_int **)&PTR__ReporterBase_002f4518;
  ReporterConfig::takeStream((ReporterConfig *)&this->m_wrapped_stream);
  pIVar3 = Detail::unique_ptr<Catch::IStream>::operator->(&this->m_wrapped_stream);
  iVar2 = (*pIVar3->_vptr_IStream[2])(pIVar3);
  this->m_stream = (ostream *)CONCAT44(extraout_var,iVar2);
  makeColourImpl((Catch *)&this->m_colour,config->m_colourMode,(this->m_wrapped_stream).m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->m_customOptions)._M_t,&(config->m_customOptions)._M_t);
  return;
}

Assistant:

ReporterBase::ReporterBase( ReporterConfig&& config ):
        IEventListener( config.fullConfig() ),
        m_wrapped_stream( CATCH_MOVE(config).takeStream() ),
        m_stream( m_wrapped_stream->stream() ),
        m_colour( makeColourImpl( config.colourMode(), m_wrapped_stream.get() ) ),
        m_customOptions( config.customOptions() )
    {}